

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestModelFactory.h
# Opt level: O2

aiScene * Assimp::TestModelFacttory::createDefaultTestModel(float *opacity)

{
  aiFace *paVar1;
  int iVar2;
  aiScene *this;
  aiMaterial **ppaVar3;
  aiMaterial *this_00;
  time_t tVar4;
  aiMesh **ppaVar5;
  aiMesh *paVar6;
  aiVector3D *paVar7;
  ulong *puVar8;
  aiFace *paVar9;
  uint *puVar10;
  aiNode *this_01;
  char *pcVar11;
  ulong uVar12;
  AssertHelper local_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertionResult gtest_ar;
  aiColor3D local_38;
  
  this = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this);
  this->mNumMaterials = 1;
  ppaVar3 = (aiMaterial **)operator_new__(8);
  this->mMaterials = ppaVar3;
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  *this->mMaterials = this_00;
  local_38.r = 1.0;
  local_38.g = 0.0;
  local_38.b = 0.0;
  local_50.ptr_._0_4_ = 0;
  local_58.data_._0_4_ = aiMaterial::AddProperty(*this->mMaterials,&local_38,1,"$clr.diffuse",0,0);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            ((internal *)&gtest_ar,"aiReturn_SUCCESS",
             "scene->mMaterials[ 0 ]->AddProperty( &color, 1, \"$clr.diffuse\",0,0 )",
             (aiReturn *)&local_50,(aiReturn *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/TestModelFactory.h"
               ,0x44,pcVar11);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  iVar2 = rand();
  *opacity = (float)iVar2 * 4.656613e-10;
  local_50.ptr_._0_4_ = 0;
  local_58.data_._0_4_ = aiMaterial::AddProperty(*this->mMaterials,opacity,1,"$mat.opacity",0,0);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            ((internal *)&gtest_ar,"aiReturn_SUCCESS",
             "scene->mMaterials[ 0 ]->AddProperty( &opacity, 1, \"$mat.opacity\",0,0 )",
             (aiReturn *)&local_50,(aiReturn *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/TestModelFactory.h"
               ,0x48,pcVar11);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  this->mNumMeshes = 1;
  ppaVar5 = (aiMesh **)operator_new__(8);
  this->mMeshes = ppaVar5;
  paVar6 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(paVar6);
  *this->mMeshes = paVar6;
  (*this->mMeshes)->mMaterialIndex = 0;
  (*this->mMeshes)->mPrimitiveTypes = 4;
  (*this->mMeshes)->mNumVertices = 3;
  paVar7 = (aiVector3D *)operator_new__(0x24);
  paVar7[2].z = 0.0;
  paVar7->x = 0.0;
  paVar7->y = 0.0;
  *(undefined8 *)&paVar7->z = 0;
  paVar7[1].y = 0.0;
  paVar7[1].z = 0.0;
  paVar7[2].x = 0.0;
  paVar7[2].y = 0.0;
  (*this->mMeshes)->mVertices = paVar7;
  paVar7 = (*this->mMeshes)->mVertices;
  paVar7->x = 1.0;
  paVar7->y = 0.0;
  paVar7->z = 0.0;
  paVar7 = (*this->mMeshes)->mVertices;
  paVar7[1].x = 0.0;
  paVar7[1].y = 1.0;
  paVar7[1].z = 0.0;
  paVar7 = (*this->mMeshes)->mVertices;
  paVar7[2].x = 0.0;
  paVar7[2].y = 0.0;
  paVar7[2].z = 1.0;
  (*this->mMeshes)->mNumFaces = 1;
  paVar6 = *this->mMeshes;
  uVar12 = (ulong)paVar6->mNumFaces;
  puVar8 = (ulong *)operator_new__(uVar12 * 0x10 + 8);
  paVar1 = (aiFace *)(puVar8 + 1);
  *puVar8 = uVar12;
  if (uVar12 != 0) {
    paVar9 = paVar1;
    do {
      paVar9->mNumIndices = 0;
      paVar9->mIndices = (uint *)0x0;
      paVar9 = paVar9 + 1;
    } while (paVar9 != paVar1 + uVar12);
  }
  paVar6->mFaces = paVar1;
  (*this->mMeshes)->mFaces->mNumIndices = 3;
  puVar10 = (uint *)operator_new__(0xc);
  (*this->mMeshes)->mFaces->mIndices = puVar10;
  *(*this->mMeshes)->mFaces->mIndices = 0;
  (*this->mMeshes)->mFaces->mIndices[1] = 1;
  (*this->mMeshes)->mFaces->mIndices[2] = 2;
  this_01 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_01);
  this->mRootNode = this_01;
  this_01->mNumMeshes = 1;
  puVar10 = (uint *)operator_new__(4);
  *puVar10 = 0;
  this_01->mMeshes = puVar10;
  return this;
}

Assistant:

static aiScene *createDefaultTestModel( float &opacity ) {
        aiScene *scene( new aiScene );
        scene->mNumMaterials = 1;
        scene->mMaterials = new aiMaterial*[scene->mNumMaterials];
        scene->mMaterials[ 0 ] = new aiMaterial;
        aiColor3D color( 1, 0, 0 );
        EXPECT_EQ( AI_SUCCESS, scene->mMaterials[ 0 ]->AddProperty( &color, 1, AI_MATKEY_COLOR_DIFFUSE ) );

        ::srand( static_cast< unsigned int >( ::time( NULL ) ) );
        opacity = float( rand() ) / float( RAND_MAX );
        EXPECT_EQ( AI_SUCCESS, scene->mMaterials[ 0 ]->AddProperty( &opacity, 1, AI_MATKEY_OPACITY ) );

        scene->mNumMeshes = 1;
        scene->mMeshes = new aiMesh*[scene->mNumMeshes];
        scene->mMeshes[ 0 ] = new aiMesh;
        scene->mMeshes[ 0 ]->mMaterialIndex = 0;
        scene->mMeshes[ 0 ]->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
        scene->mMeshes[ 0 ]->mNumVertices = 3;
        scene->mMeshes[ 0 ]->mVertices = new aiVector3D[ 3 ];
        scene->mMeshes[ 0 ]->mVertices[ 0 ] = aiVector3D( 1, 0, 0 );
        scene->mMeshes[ 0 ]->mVertices[ 1 ] = aiVector3D( 0, 1, 0 );
        scene->mMeshes[ 0 ]->mVertices[ 2 ] = aiVector3D( 0, 0, 1 );
        scene->mMeshes[ 0 ]->mNumFaces = 1;
        scene->mMeshes[ 0 ]->mFaces = new aiFace[scene->mMeshes[ 0 ]->mNumFaces];
        scene->mMeshes[ 0 ]->mFaces[ 0 ].mNumIndices = 3;
        scene->mMeshes[ 0 ]->mFaces[ 0 ].mIndices = new unsigned int[ 3 ];
        scene->mMeshes[ 0 ]->mFaces[ 0 ].mIndices[ 0 ] = 0;
        scene->mMeshes[ 0 ]->mFaces[ 0 ].mIndices[ 1 ] = 1;
        scene->mMeshes[ 0 ]->mFaces[ 0 ].mIndices[ 2 ] = 2;

        scene->mRootNode = new aiNode();
        scene->mRootNode->mNumMeshes = 1;
        scene->mRootNode->mMeshes = new unsigned int[1]{ 0 };

        return scene;
    }